

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

string * __thiscall
spirv_cross::Compiler::get_remapped_declared_block_name_abi_cxx11_
          (string *__return_storage_ptr__,Compiler *this,uint32_t id,
          bool fallback_prefer_instance_name)

{
  const_iterator cVar1;
  SPIRVariable *pSVar2;
  SPIRType *pSVar3;
  Meta *pMVar4;
  size_type sVar5;
  pointer pcVar6;
  uint local_1c;
  
  local_1c = id;
  cVar1 = ::std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->declared_block_names)._M_h,&local_1c);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    pSVar2 = Variant::get<spirv_cross::SPIRVariable>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + local_1c);
    if (fallback_prefer_instance_name) {
      (*this->_vptr_Compiler[6])
                (__return_storage_ptr__,this,(ulong)(pSVar2->super_IVariant).self.id,1);
      return __return_storage_ptr__;
    }
    pSVar3 = Variant::get<spirv_cross::SPIRType>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)&(pSVar2->super_IVariant).field_0xc);
    pMVar4 = ParsedIR::find_meta(&this->ir,(ID)(pSVar3->super_IVariant).self.id);
    if ((pMVar4 == (Meta *)0x0) || (sVar5 = (pMVar4->decoration).alias._M_string_length, sVar5 == 0)
       ) {
      (*this->_vptr_Compiler[4])(__return_storage_ptr__,this,(ulong)local_1c);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = (pMVar4->decoration).alias._M_dataplus._M_p;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar6 = *(pointer *)
              ((long)cVar1.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                     ._M_cur + 0x10);
    sVar5 = *(size_type *)
             ((long)cVar1.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                    ._M_cur + 0x18);
  }
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar6,pcVar6 + sVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string Compiler::get_remapped_declared_block_name(uint32_t id, bool fallback_prefer_instance_name) const
{
	auto itr = declared_block_names.find(id);
	if (itr != end(declared_block_names))
	{
		return itr->second;
	}
	else
	{
		auto &var = get<SPIRVariable>(id);

		if (fallback_prefer_instance_name)
		{
			return to_name(var.self);
		}
		else
		{
			auto &type = get<SPIRType>(var.basetype);
			auto *type_meta = ir.find_meta(type.self);
			auto *block_name = type_meta ? &type_meta->decoration.alias : nullptr;
			return (!block_name || block_name->empty()) ? get_block_fallback_name(id) : *block_name;
		}
	}
}